

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void myarima_summary(myarima_object obj)

{
  long lVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  sarimax_object psVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  psVar8 = obj->sarimax;
  iVar7 = psVar8->q;
  iVar11 = psVar8->p;
  iVar3 = psVar8->P;
  iVar4 = psVar8->M;
  iVar5 = psVar8->r;
  iVar6 = psVar8->Q;
  if ((uint)psVar8->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->sarimax->retval);
    printf("Exit Message : ");
    uVar9 = obj->sarimax->retval;
    if (((ulong)uVar9 < 0x10) && ((0x9493U >> (uVar9 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_994_0015dd10)[uVar9]);
    }
  }
  iVar7 = iVar7 + iVar11 + iVar3 + iVar6 + iVar4;
  puts("\n");
  psVar8 = obj->sarimax;
  iVar11 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)psVar8->p,
         (ulong)(uint)psVar8->d,(ulong)(uint)psVar8->q,(ulong)(uint)psVar8->P,(ulong)(uint)psVar8->D
         ,psVar8->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  psVar8 = obj->sarimax;
  if (0 < psVar8->p) {
    lVar12 = 0;
    do {
      dVar2 = psVar8->phi[lVar12];
      if (psVar8->vcov[iVar11] < 0.0) {
        sqrt(psVar8->vcov[iVar11]);
      }
      lVar1 = lVar12 + 1;
      printf("AR%-15d%-20g%-20g \n",dVar2,(ulong)((int)lVar12 + 1));
      psVar8 = obj->sarimax;
      iVar11 = iVar11 + iVar7 + 1;
      lVar12 = lVar1;
    } while (lVar1 < psVar8->p);
  }
  psVar8 = obj->sarimax;
  if (0 < psVar8->q) {
    lVar12 = 0;
    do {
      iVar11 = (int)lVar12;
      dVar2 = psVar8->theta[lVar12];
      if (psVar8->vcov[(psVar8->p + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(psVar8->vcov[(psVar8->p + iVar11) * (iVar7 + 1)]);
      }
      lVar12 = lVar12 + 1;
      printf("MA%-15d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
      psVar8 = obj->sarimax;
    } while (lVar12 < psVar8->q);
  }
  psVar8 = obj->sarimax;
  if (0 < psVar8->P) {
    lVar12 = 0;
    do {
      iVar11 = (int)lVar12;
      dVar2 = psVar8->PHI[lVar12];
      if (psVar8->vcov[(psVar8->p + psVar8->q + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(psVar8->vcov[(psVar8->p + psVar8->q + iVar11) * (iVar7 + 1)]);
      }
      lVar12 = lVar12 + 1;
      printf("SAR%-14d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
      psVar8 = obj->sarimax;
    } while (lVar12 < psVar8->P);
  }
  psVar8 = obj->sarimax;
  if (0 < psVar8->Q) {
    lVar12 = 0;
    do {
      iVar11 = (int)lVar12;
      dVar2 = psVar8->THETA[lVar12];
      if (psVar8->vcov[(psVar8->p + psVar8->q + psVar8->P + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(psVar8->vcov[(psVar8->p + psVar8->q + psVar8->P + iVar11) * (iVar7 + 1)]);
      }
      lVar12 = lVar12 + 1;
      printf("SMA%-14d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
      psVar8 = obj->sarimax;
    } while (lVar12 < psVar8->Q);
  }
  putchar(10);
  psVar8 = obj->sarimax;
  iVar11 = psVar8->q + psVar8->p + psVar8->P + psVar8->Q;
  dVar2 = psVar8->mean;
  if (iVar5 < iVar4) {
    if (psVar8->vcov[(iVar7 + 1) * iVar11] < 0.0) {
      sqrt(psVar8->vcov[(iVar7 + 1) * iVar11]);
    }
    printf("%-17s%-20g%-20g \n",dVar2,"MEAN");
    iVar11 = iVar11 + 1;
  }
  else {
    printf("%-17s%-20g \n",dVar2,"MEAN");
  }
  if (obj->idrift == 1) {
    dVar2 = *obj->sarimax->exog;
    dVar13 = obj->sarimax->vcov[(iVar7 + 1) * iVar11];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    printf("%-17s%-20g%-20g \n",dVar2,dVar13,"TREND");
    iVar11 = iVar11 + 1;
    uVar9 = 1;
  }
  else {
    printf("%-17s%-20g \n",0,"TREND");
    uVar9 = 0;
  }
  psVar8 = obj->sarimax;
  if ((int)uVar9 < psVar8->r) {
    uVar10 = (ulong)uVar9;
    iVar11 = iVar11 * (iVar7 + 1);
    do {
      dVar2 = psVar8->exog[uVar10];
      dVar13 = psVar8->vcov[iVar11];
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      printf("%-17s%-20g%-20g \n",dVar2,dVar13,"EXOG");
      uVar10 = uVar10 + 1;
      psVar8 = obj->sarimax;
      iVar11 = iVar11 + iVar7 + 1;
    } while ((int)uVar10 < psVar8->r);
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  uVar10 = (ulong)(uint)obj->sarimax->method;
  if (uVar10 < 3) {
    printf(*(char **)(&DAT_0015dd90 + uVar10 * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  uVar10 = (ulong)(uint)obj->sarimax->optmethod;
  if (uVar10 < 8) {
    printf((&PTR_anon_var_dwarf_b0d_0015dda8)[uVar10]);
  }
  puts("\n");
  printf("AIC criterion : %g ",obj->aic);
  puts("\n");
  printf("BIC criterion : %g ",obj->bic);
  puts("\n");
  printf("AICC criterion : %g ",obj->aicc);
  puts("\n");
  if (2 < (uint)obj->sarimax->method) {
    return;
  }
  printf("Log Likelihood : %g ",obj->sarimax->loglik);
  puts("\n");
  return;
}

Assistant:

void myarima_summary(myarima_object obj) {
	int i, pq,t,nd,ncxreg,mean;
	pq = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M;
	mean = obj->sarimax->M - obj->sarimax->r;
	
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->sarimax->retval);
		printf("Exit Message : ");

		if (obj->sarimax->retval == 0) {
			printf("Input Error");
		}
		else if (obj->sarimax->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->sarimax->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->sarimax->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->sarimax->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->sarimax->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->sarimax->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->sarimax->p,obj->sarimax->d,obj->sarimax->q,
	 obj->sarimax->P,obj->sarimax->D,obj->sarimax->Q );
	printf("\n");
	//mdisplay(obj->vcov,pq,pq);
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->sarimax->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->sarimax->phi[i], sqrt(obj->sarimax->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->sarimax->q; ++i) {
		t = obj->sarimax->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->sarimax->theta[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->P; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->sarimax->PHI[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->Q; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->sarimax->THETA[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->sarimax->mean, sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->sarimax->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->sarimax->exog[0], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->sarimax->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->sarimax->exog[i], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->sarimax->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->sarimax->method == 1) {
		printf("MLE");
	}
	else if (obj->sarimax->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->sarimax->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->sarimax->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->sarimax->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->sarimax->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->sarimax->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->sarimax->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->sarimax->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->sarimax->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1 || obj->sarimax->method == 2) {
		printf("Log Likelihood : %g ", obj->sarimax->loglik);
		printf("\n\n");
	}
}